

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O0

void __thiscall
vkt::synchronization::anon_unknown_0::ShaderAccess::BufferSupport::BufferSupport
          (BufferSupport *this,ResourceDescription *resourceDesc,BufferType bufferType,
          AccessMode mode,VkShaderStageFlagBits stage,DispatchCall dispatchCall)

{
  char *pcVar1;
  allocator<char> local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  DispatchCall local_28;
  VkShaderStageFlagBits local_24;
  DispatchCall dispatchCall_local;
  VkShaderStageFlagBits stage_local;
  AccessMode mode_local;
  BufferType bufferType_local;
  ResourceDescription *resourceDesc_local;
  BufferSupport *this_local;
  
  local_28 = dispatchCall;
  local_24 = stage;
  dispatchCall_local = mode;
  stage_local = bufferType;
  _mode_local = resourceDesc;
  resourceDesc_local = (ResourceDescription *)this;
  OperationSupport::OperationSupport(&this->super_OperationSupport);
  (this->super_OperationSupport)._vptr_OperationSupport = (_func_int **)&PTR__BufferSupport_016b3450
  ;
  ResourceDescription::ResourceDescription(&this->m_resourceDesc,_mode_local);
  this->m_bufferType = stage_local;
  this->m_mode = dispatchCall_local;
  this->m_stage = local_24;
  pcVar1 = "write_";
  if (this->m_mode == ACCESS_MODE_READ) {
    pcVar1 = "read_";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,pcVar1,&local_59);
  pcVar1 = "ssbo_";
  if (this->m_bufferType == BUFFER_TYPE_UNIFORM) {
    pcVar1 = "ubo_";
  }
  std::operator+(&this->m_shaderPrefix,&local_58,pcVar1);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  this->m_dispatchCall = local_28;
  assertValidShaderStage(this->m_stage);
  return;
}

Assistant:

BufferSupport (const ResourceDescription&	resourceDesc,
				   const BufferType				bufferType,
				   const AccessMode				mode,
				   const VkShaderStageFlagBits	stage,
				   const DispatchCall			dispatchCall = DISPATCH_CALL_DISPATCH)
		: m_resourceDesc	(resourceDesc)
		, m_bufferType		(bufferType)
		, m_mode			(mode)
		, m_stage			(stage)
		, m_shaderPrefix	(std::string(m_mode == ACCESS_MODE_READ ? "read_" : "write_") + (m_bufferType == BUFFER_TYPE_UNIFORM ? "ubo_" : "ssbo_"))
		, m_dispatchCall	(dispatchCall)
	{
		DE_ASSERT(m_resourceDesc.type == RESOURCE_TYPE_BUFFER);
		DE_ASSERT(m_bufferType == BUFFER_TYPE_UNIFORM || m_bufferType == BUFFER_TYPE_STORAGE);
		DE_ASSERT(m_mode == ACCESS_MODE_READ || m_mode == ACCESS_MODE_WRITE);
		DE_ASSERT(m_mode == ACCESS_MODE_READ || m_bufferType == BUFFER_TYPE_STORAGE);
		DE_ASSERT(m_bufferType != BUFFER_TYPE_UNIFORM || m_resourceDesc.size.x() <= MAX_UBO_RANGE);
		DE_ASSERT(m_dispatchCall == DISPATCH_CALL_DISPATCH || m_dispatchCall == DISPATCH_CALL_DISPATCH_INDIRECT);

		assertValidShaderStage(m_stage);
	}